

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>
                   (string *__return_storage_ptr__,char (*a) [33],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   char (*args) [10],long *args_1,char (*args_2) [17],unsigned_long *args_3,
                   char (*args_4) [3],unsigned_long *args_5,char (*args_6) [3])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_318;
  cmAlphaNum local_2e0;
  cmAlphaNum local_2a8;
  cmAlphaNum local_270;
  cmAlphaNum local_238;
  cmAlphaNum local_200;
  cmAlphaNum local_1c8;
  cmAlphaNum local_190;
  cmAlphaNum local_158;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_120;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_108;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_f0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [17];
  char (*args_local_2) [17];
  long *args_local_1;
  char (*args_local) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  char (*a_local) [33];
  
  local_38 = args_2;
  args_local_2 = (char (*) [17])args_1;
  args_local_1 = (long *)args;
  args_local = (char (*) [10])b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (char (*) [33])__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_158,*a);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_120,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_158);
  cmAlphaNum::cmAlphaNum(&local_190,(string *)args_local);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_108,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_190);
  cmAlphaNum::cmAlphaNum(&local_1c8,(char *)args_local_1);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_f0,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_1c8);
  cmAlphaNum::cmAlphaNum(&local_200,*(long *)*args_local_2);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_d8,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_200);
  cmAlphaNum::cmAlphaNum(&local_238,*local_38);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_238);
  cmAlphaNum::cmAlphaNum(&local_270,*args_3);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_270);
  cmAlphaNum::cmAlphaNum(&local_2a8,*args_4);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_2a8);
  cmAlphaNum::cmAlphaNum(&local_2e0,*args_5);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_2e0);
  cmAlphaNum::cmAlphaNum(&local_318,*args_6);
  cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long&&,char_const(&)[3])
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[10],long&,char_const(&)[17],unsigned_long&,char_const(&)[3],unsigned_long,char_const(&)[3]>(char_const&[],std::__cxx11::string&,char_const&[],long&,char_const&[],unsigned_long&,char_const&[],unsigned_long&&,char_const&[])
              ::makePair,&local_318);
  local_48 = &local_120;
  local_40 = 9;
  views._M_len = 9;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}